

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.h
# Opt level: O0

void __thiscall CGL::BBox::expand(BBox *this,BBox *bbox)

{
  double *pdVar1;
  double *in_RSI;
  Vector3D *in_RDI;
  Vector3D *in_stack_ffffffffffffffb8;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  
  pdVar1 = std::min<double>((double *)(in_RDI + 1),in_RSI + 4);
  in_RDI[1].field_0.field_0.x = *pdVar1;
  pdVar1 = std::min<double>(&in_RDI[1].field_0.field_0.y,in_RSI + 5);
  in_RDI[1].field_0.field_0.y = *pdVar1;
  pdVar1 = std::min<double>(&in_RDI[1].field_0.field_0.z,in_RSI + 6);
  in_RDI[1].field_0.field_0.z = *pdVar1;
  pdVar1 = std::max<double>((double *)in_RDI,in_RSI);
  (in_RDI->field_0).field_0.x = *pdVar1;
  pdVar1 = std::max<double>(&(in_RDI->field_0).field_0.y,in_RSI + 1);
  (in_RDI->field_0).field_0.y = *pdVar1;
  pdVar1 = std::max<double>(&(in_RDI->field_0).field_0.z,in_RSI + 2);
  (in_RDI->field_0).field_0.z = *pdVar1;
  Vector3D::operator-(in_RDI,in_stack_ffffffffffffffb8);
  in_RDI[2].field_0.field_0.x = local_38;
  in_RDI[2].field_0.field_0.y = local_30;
  in_RDI[2].field_0.field_0.z = local_28;
  *(undefined8 *)((long)&in_RDI[2].field_0 + 0x18) = local_20;
  return;
}

Assistant:

void expand(const BBox& bbox) {
    min.x = std::min(min.x, bbox.min.x);
    min.y = std::min(min.y, bbox.min.y);
    min.z = std::min(min.z, bbox.min.z);
    max.x = std::max(max.x, bbox.max.x);
    max.y = std::max(max.y, bbox.max.y);
    max.z = std::max(max.z, bbox.max.z);
    extent = max - min;
  }